

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_32bit_z2_Nx8_avx2
               (int N,uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,
               int upsample_above,int upsample_left,int dx,int dy)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  uint uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  long in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  long in_R8;
  uint in_R9D;
  int iVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  byte bStack0000000000000008;
  __m256i mask256;
  __m256i base_y_c256;
  __m256i y_c256;
  __m256i dy256;
  __m256i c256;
  __m256i r6;
  int base_y_c [8];
  __m128i atmp3;
  __m128i atmp2;
  __m128i atmp1;
  __m128i atmp0;
  __m128i mask;
  int base_min_diff;
  int base_shift;
  int base_x;
  int y;
  __m128i resxy;
  __m128i resy;
  __m128i resx;
  __m256i shift;
  __m256i res;
  __m256i b;
  int r;
  __m128i a1_x128;
  __m128i a0_x128;
  __m256i diff;
  __m256i min_base_y256;
  __m256i c3f;
  __m256i a16;
  __m256i a32;
  __m256i a1_y;
  __m256i a0_y;
  __m256i a1_x;
  __m256i a0_x;
  int frac_bits_y;
  int frac_bits_x;
  int min_base_y;
  int min_base_x;
  int local_1040;
  int iStack_103c;
  int iStack_1038;
  int iStack_1034;
  int iStack_1030;
  int iStack_102c;
  int iStack_1028;
  int iStack_1024;
  int local_fc0;
  int local_fbc;
  undefined8 local_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 local_f90;
  undefined8 uStack_f88;
  undefined1 local_f80 [32];
  int local_f04;
  undefined1 local_f00 [16];
  undefined1 local_ef0 [16];
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  byte local_dac;
  undefined8 *local_d90;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_190;
  undefined8 uStack_188;
  
  local_dac = (byte)in_R9D;
  iVar27 = -(1 << (local_dac & 0x1f));
  uVar24 = -(1 << (bStack0000000000000008 & 0x1f));
  auVar2 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
  auVar2 = vpinsrd_avx(auVar2,0x10,2);
  auVar2 = vpinsrd_avx(auVar2,0x10,3);
  auVar3 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
  auVar3 = vpinsrd_avx(auVar3,0x10,2);
  auVar3 = vpinsrd_avx(auVar3,0x10,3);
  uStack_970 = auVar3._0_8_;
  uStack_968 = auVar3._8_8_;
  auVar3 = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
  auVar3 = vpinsrd_avx(auVar3,0x3f,2);
  auVar3 = vpinsrd_avx(auVar3,0x3f,3);
  auVar4 = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
  auVar4 = vpinsrd_avx(auVar4,0x3f,2);
  auVar4 = vpinsrd_avx(auVar4,0x3f,3);
  uStack_930 = auVar4._0_8_;
  uStack_928 = auVar4._8_8_;
  auVar4 = vpinsrd_avx(ZEXT416(uVar24),uVar24,1);
  auVar4 = vpinsrd_avx(auVar4,uVar24,2);
  auVar4 = vpinsrd_avx(auVar4,uVar24,3);
  auVar5 = vpinsrd_avx(ZEXT416(uVar24),uVar24,1);
  auVar5 = vpinsrd_avx(auVar5,uVar24,2);
  auVar5 = vpinsrd_avx(auVar5,uVar24,3);
  auVar29 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
  local_f04 = 0;
  local_d90 = in_RSI;
  while( true ) {
    uStack_ea8 = auVar29._8_8_;
    uStack_eb0 = auVar29._0_8_;
    if (in_EDI <= local_f04) break;
    iVar25 = local_f04 + 1;
    iVar26 = -iVar25 * upsample_left >> (6 - local_dac & 0x1f);
    local_fbc = 0;
    if (iVar26 < iVar27 + -1) {
      local_fbc = (iVar27 - iVar26) + -1 >> (local_dac & 0x1f);
    }
    local_fc0 = (int)((iVar27 - iVar26) + in_R9D) >> (local_dac & 0x1f);
    if (local_fc0 < 9) {
      if (local_fc0 < 0) {
        local_fc0 = 0;
      }
    }
    else {
      local_fc0 = 8;
    }
    if (local_fbc < 8) {
      auVar6 = *(undefined1 (*) [16])(in_RCX + (long)iVar26 * 2 + (long)local_fbc * 2);
      if (in_R9D == 0) {
        local_ef0 = vpshufb_avx(auVar6,(undefined1  [16])HighbdLoadMaskx[local_fbc]);
        local_f00 = vpshufb_avx(*(undefined1 (*) [16])
                                 (in_RCX + (long)iVar26 * 2 + 2 + (long)local_fbc * 2),
                                (undefined1  [16])HighbdLoadMaskx[local_fbc]);
        iVar28 = iVar25 * upsample_left;
        auVar6 = vpinsrd_avx(ZEXT416(0x100 - iVar28),0x140 - iVar28,1);
        auVar6 = vpinsrd_avx(auVar6,0x180 - iVar28,2);
        auVar6 = vpinsrd_avx(auVar6,0x1c0 - iVar28,3);
        auVar7 = vpinsrd_avx(ZEXT416((uint)(-iVar25 * upsample_left)),0x40 - iVar28,1);
        auVar7 = vpinsrd_avx(auVar7,0x80 - iVar28,2);
        auVar7 = vpinsrd_avx(auVar7,0xc0 - iVar28,3);
        auVar30 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar6;
        uStack_1f0 = auVar30._0_8_;
        uStack_1e8 = auVar30._8_8_;
        auVar11._16_8_ = uStack_1f0;
        auVar11._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar7;
        auVar11._24_8_ = uStack_1e8;
        auVar10._16_8_ = uStack_930;
        auVar10._0_16_ = auVar3;
        auVar10._24_8_ = uStack_928;
        auVar10 = vpand_avx2(auVar11,auVar10);
        local_f80 = vpsrld_avx2(auVar10,ZEXT416(1));
      }
      else {
        pauVar1 = (undefined1 (*) [16])(in_RCX + (long)iVar26 * 2 + 0x10 + (long)local_fbc * 2);
        auVar7 = vpshufb_avx(auVar6,*(undefined1 (*) [16])HighbdEvenOddMaskx[local_fbc]);
        auVar30 = vpshufb_avx(*pauVar1,*(undefined1 (*) [16])HighbdEvenOddMaskx[local_fbc]);
        auVar8 = vpshufb_avx(auVar6,*(undefined1 (*) [16])(HighbdEvenOddMaskx[local_fbc] + 0x10));
        auVar9 = vpshufb_avx(*pauVar1,*(undefined1 (*) [16])(HighbdEvenOddMaskx[local_fbc] + 0x10));
        auVar6 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
        auVar6 = vpinsrb_avx(auVar6,0xf,2);
        auVar6 = vpinsrb_avx(auVar6,0xf,3);
        auVar6 = vpinsrb_avx(auVar6,0xf,4);
        auVar6 = vpinsrb_avx(auVar6,0xf,5);
        auVar6 = vpinsrb_avx(auVar6,0xf,6);
        auVar6 = vpinsrb_avx(auVar6,0xf,7);
        auVar6 = vpinsrb_avx(auVar6,0xf,8);
        auVar6 = vpinsrb_avx(auVar6,0xf,9);
        auVar6 = vpinsrb_avx(auVar6,0xf,10);
        auVar6 = vpinsrb_avx(auVar6,0xf,0xb);
        auVar6 = vpinsrb_avx(auVar6,0xf,0xc);
        auVar6 = vpinsrb_avx(auVar6,0xf,0xd);
        auVar6 = vpinsrb_avx(auVar6,0xf,0xe);
        auVar6 = vpinsrb_avx(auVar6,0xf,0xf);
        auVar6 = vpcmpgtb_avx(*(undefined1 (*) [16])HighbdEvenOddMaskx[local_fbc],auVar6);
        local_ef0 = vpblendvb_avx(auVar7,auVar30,auVar6);
        auVar6 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
        auVar6 = vpinsrb_avx(auVar6,0xf,2);
        auVar6 = vpinsrb_avx(auVar6,0xf,3);
        auVar6 = vpinsrb_avx(auVar6,0xf,4);
        auVar6 = vpinsrb_avx(auVar6,0xf,5);
        auVar6 = vpinsrb_avx(auVar6,0xf,6);
        auVar6 = vpinsrb_avx(auVar6,0xf,7);
        auVar6 = vpinsrb_avx(auVar6,0xf,8);
        auVar6 = vpinsrb_avx(auVar6,0xf,9);
        auVar6 = vpinsrb_avx(auVar6,0xf,10);
        auVar6 = vpinsrb_avx(auVar6,0xf,0xb);
        auVar6 = vpinsrb_avx(auVar6,0xf,0xc);
        auVar6 = vpinsrb_avx(auVar6,0xf,0xd);
        auVar6 = vpinsrb_avx(auVar6,0xf,0xe);
        auVar6 = vpinsrb_avx(auVar6,0xf,0xf);
        auVar6 = vpcmpgtb_avx(*(undefined1 (*) [16])(HighbdEvenOddMaskx[local_fbc] + 0x10),auVar6);
        local_f00 = vpblendvb_avx(auVar8,auVar9,auVar6);
        iVar28 = iVar25 * upsample_left;
        auVar6 = vpinsrd_avx(ZEXT416(0x100 - iVar28),0x140 - iVar28,1);
        auVar6 = vpinsrd_avx(auVar6,0x180 - iVar28,2);
        auVar6 = vpinsrd_avx(auVar6,0x1c0 - iVar28,3);
        auVar7 = vpinsrd_avx(ZEXT416((uint)(-iVar25 * upsample_left)),0x40 - iVar28,1);
        auVar7 = vpinsrd_avx(auVar7,0x80 - iVar28,2);
        auVar7 = vpinsrd_avx(auVar7,0xc0 - iVar28,3);
        auVar30 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar6;
        uStack_190 = auVar30._0_8_;
        uStack_188 = auVar30._8_8_;
        auVar15._16_8_ = uStack_190;
        auVar15._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar7;
        auVar15._24_8_ = uStack_188;
        auVar10 = vpslld_avx2(auVar15,ZEXT416(in_R9D));
        auVar12._16_8_ = uStack_930;
        auVar12._0_16_ = auVar3;
        auVar12._24_8_ = uStack_928;
        auVar10 = vpand_avx2(auVar10,auVar12);
        local_f80 = vpsrld_avx2(auVar10,ZEXT416(1));
      }
      auVar10 = vpmovzxwd_avx2(local_ef0);
      auVar11 = vpmovzxwd_avx2(local_f00);
      auVar11 = vpsubd_avx2(auVar11,auVar10);
      auVar10 = vpslld_avx2(auVar10,ZEXT416(5));
      auVar18._16_8_ = uStack_970;
      auVar18._0_16_ = auVar2;
      auVar18._24_8_ = uStack_968;
      auVar10 = vpaddd_avx2(auVar10,auVar18);
      auVar11 = vpmulld_avx2(auVar11,local_f80);
      auVar10 = vpaddd_avx2(auVar10,auVar11);
      auVar10 = vpsrld_avx2(auVar10,ZEXT416(5));
      auVar22._16_16_ = ZEXT416(5);
      auVar22._0_16_ = auVar10._16_16_;
      auVar10 = vpackusdw_avx2(auVar10,auVar22);
      local_d60 = auVar10._0_8_;
      uStack_d58 = auVar10._8_8_;
      local_f90 = local_d60;
      uStack_f88 = uStack_d58;
    }
    else {
      local_f90 = 0;
      uStack_f88 = 0;
    }
    if (iVar26 < iVar27) {
      uVar24 = local_f04 << 6;
      auVar6 = vpinsrd_avx(ZEXT416(uVar24),uVar24,1);
      auVar6 = vpinsrd_avx(auVar6,uVar24,2);
      auVar6 = vpinsrd_avx(auVar6,uVar24,3);
      auVar7 = vpinsrd_avx(ZEXT416(uVar24),uVar24,1);
      auVar7 = vpinsrd_avx(auVar7,uVar24,2);
      auVar7 = vpinsrd_avx(auVar7,uVar24,3);
      uStack_8b0 = auVar7._0_8_;
      uStack_8a8 = auVar7._8_8_;
      auVar7 = vpinsrd_avx(ZEXT416((uint)dx),dx,1);
      auVar7 = vpinsrd_avx(auVar7,dx,2);
      auVar7 = vpinsrd_avx(auVar7,dx,3);
      auVar30 = vpinsrd_avx(ZEXT416((uint)dx),dx,1);
      auVar30 = vpinsrd_avx(auVar30,dx,2);
      auVar30 = vpinsrd_avx(auVar30,dx,3);
      uStack_870 = auVar30._0_8_;
      uStack_868 = auVar30._8_8_;
      auVar30 = vpinsrd_avx(ZEXT416(1),2,1);
      auVar30 = vpinsrd_avx(auVar30,3,2);
      auVar30 = vpinsrd_avx(auVar30,4,3);
      auVar8 = vpinsrd_avx(ZEXT416(5),6,1);
      auVar8 = vpinsrd_avx(auVar8,7,2);
      auVar8 = vpinsrd_avx(auVar8,8,3);
      uStack_250 = auVar8._0_8_;
      uStack_248 = auVar8._8_8_;
      auVar20._16_8_ = uStack_250;
      auVar20._0_16_ = auVar30;
      auVar20._24_8_ = uStack_248;
      auVar19._16_8_ = uStack_870;
      auVar19._0_16_ = auVar7;
      auVar19._24_8_ = uStack_868;
      auVar10 = vpmulld_avx2(auVar20,auVar19);
      auVar16._16_8_ = uStack_8b0;
      auVar16._0_16_ = auVar6;
      auVar16._24_8_ = uStack_8a8;
      auVar12 = vpsubd_avx2(auVar16,auVar10);
      auVar11 = vpsrad_avx2(auVar12,ZEXT416(6 - _bStack0000000000000008));
      auVar23._16_8_ = uStack_eb0;
      auVar23._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
      auVar23._24_8_ = uStack_ea8;
      auVar10 = vpcmpgtd_avx2(auVar23,auVar11);
      auVar10 = vpandn_avx2(auVar10,auVar11);
      iStack_103c = auVar10._4_4_;
      local_1040 = auVar10._0_4_;
      iStack_1034 = auVar10._12_4_;
      iStack_1038 = auVar10._8_4_;
      iStack_102c = auVar10._20_4_;
      iStack_1030 = auVar10._16_4_;
      iStack_1024 = auVar10._28_4_;
      iStack_1028 = auVar10._24_4_;
      auVar6 = vpinsrw_avx(ZEXT216(*(ushort *)(in_R8 + (long)local_1040 * 2)),
                           (uint)*(ushort *)(in_R8 + (long)iStack_103c * 2),1);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)(in_R8 + (long)iStack_1038 * 2),2);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)(in_R8 + (long)iStack_1034 * 2),3);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)(in_R8 + (long)iStack_1030 * 2),4);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)(in_R8 + (long)iStack_102c * 2),5);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)(in_R8 + (long)iStack_1028 * 2),6);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)(in_R8 + (long)iStack_1024 * 2),7);
      auVar10 = vpmovzxwd_avx2(auVar6);
      auVar6 = vpinsrw_avx(ZEXT216(*(ushort *)(in_R8 + 2 + (long)local_1040 * 2)),
                           (uint)*(ushort *)(in_R8 + 2 + (long)iStack_103c * 2),1);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)(in_R8 + 2 + (long)iStack_1038 * 2),2);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)(in_R8 + 2 + (long)iStack_1034 * 2),3);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)(in_R8 + 2 + (long)iStack_1030 * 2),4);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)(in_R8 + 2 + (long)iStack_102c * 2),5);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)(in_R8 + 2 + (long)iStack_1028 * 2),6);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)(in_R8 + 2 + (long)iStack_1024 * 2),7);
      auVar11 = vpmovzxwd_avx2(auVar6);
      if (_bStack0000000000000008 == 0) {
        auVar13._16_8_ = uStack_930;
        auVar13._0_16_ = auVar3;
        auVar13._24_8_ = uStack_928;
        auVar12 = vpand_avx2(auVar12,auVar13);
        local_f80 = vpsrld_avx2(auVar12,ZEXT416(1));
      }
      else {
        auVar12 = vpslld_avx2(auVar12,ZEXT416(_bStack0000000000000008));
        auVar14._16_8_ = uStack_930;
        auVar14._0_16_ = auVar3;
        auVar14._24_8_ = uStack_928;
        auVar12 = vpand_avx2(auVar12,auVar14);
        local_f80 = vpsrld_avx2(auVar12,ZEXT416(1));
      }
      auVar11 = vpsubd_avx2(auVar11,auVar10);
      auVar10 = vpslld_avx2(auVar10,ZEXT416(5));
      auVar17._16_8_ = uStack_970;
      auVar17._0_16_ = auVar2;
      auVar17._24_8_ = uStack_968;
      auVar10 = vpaddd_avx2(auVar10,auVar17);
      auVar11 = vpmulld_avx2(auVar11,local_f80);
      auVar10 = vpaddd_avx2(auVar10,auVar11);
      auVar10 = vpsrld_avx2(auVar10,ZEXT416(5));
      auVar21._16_16_ = ZEXT416(5);
      auVar21._0_16_ = auVar10._16_16_;
      auVar10 = vpackusdw_avx2(auVar10,auVar21);
      local_d80 = auVar10._0_8_;
      uStack_d78 = auVar10._8_8_;
      local_fa0 = local_d80;
      uStack_f98 = uStack_d78;
    }
    else {
      local_fa0 = local_f90;
      uStack_f98 = uStack_f88;
    }
    auVar7._8_8_ = uStack_f88;
    auVar7._0_8_ = local_f90;
    auVar6._8_8_ = uStack_f98;
    auVar6._0_8_ = local_fa0;
    auVar6 = vpblendvb_avx(auVar7,auVar6,*(undefined1 (*) [16])HighbdBaseMask[local_fc0]);
    local_fb0 = auVar6._0_8_;
    uStack_fa8 = auVar6._8_8_;
    *local_d90 = local_fb0;
    local_d90[1] = uStack_fa8;
    local_d90 = (undefined8 *)(in_RDX * 2 + (long)local_d90);
    local_f04 = local_f04 + 1;
  }
  return;
}

Assistant:

static void highbd_dr_prediction_32bit_z2_Nx8_avx2(
    int N, uint16_t *dst, ptrdiff_t stride, const uint16_t *above,
    const uint16_t *left, int upsample_above, int upsample_left, int dx,
    int dy) {
  const int min_base_x = -(1 << upsample_above);
  const int min_base_y = -(1 << upsample_left);
  const int frac_bits_x = 6 - upsample_above;
  const int frac_bits_y = 6 - upsample_left;

  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m256i a0_x, a1_x, a0_y, a1_y, a32, a16, c3f, min_base_y256;
  __m256i diff;
  __m128i a0_x128, a1_x128;

  a16 = _mm256_set1_epi32(16);
  c3f = _mm256_set1_epi32(0x3f);
  min_base_y256 = _mm256_set1_epi32(min_base_y);

  for (int r = 0; r < N; r++) {
    __m256i b, res, shift;
    __m128i resx, resy, resxy;
    int y = r + 1;
    int base_x = (-y * dx) >> frac_bits_x;
    int base_shift = 0;
    if (base_x < (min_base_x - 1)) {
      base_shift = (min_base_x - base_x - 1) >> upsample_above;
    }
    int base_min_diff =
        (min_base_x - base_x + upsample_above) >> upsample_above;
    if (base_min_diff > 8) {
      base_min_diff = 8;
    } else {
      if (base_min_diff < 0) base_min_diff = 0;
    }

    if (base_shift > 7) {
      resx = _mm_setzero_si128();
    } else {
      a0_x128 = _mm_loadu_si128((__m128i *)(above + base_x + base_shift));
      if (upsample_above) {
        __m128i mask, atmp0, atmp1, atmp2, atmp3;
        a1_x128 = _mm_loadu_si128((__m128i *)(above + base_x + 8 + base_shift));
        atmp0 = _mm_shuffle_epi8(a0_x128,
                                 *(__m128i *)HighbdEvenOddMaskx[base_shift]);
        atmp1 = _mm_shuffle_epi8(a1_x128,
                                 *(__m128i *)HighbdEvenOddMaskx[base_shift]);
        atmp2 = _mm_shuffle_epi8(
            a0_x128, *(__m128i *)(HighbdEvenOddMaskx[base_shift] + 16));
        atmp3 = _mm_shuffle_epi8(
            a1_x128, *(__m128i *)(HighbdEvenOddMaskx[base_shift] + 16));
        mask = _mm_cmpgt_epi8(*(__m128i *)HighbdEvenOddMaskx[base_shift],
                              _mm_set1_epi8(15));
        a0_x128 = _mm_blendv_epi8(atmp0, atmp1, mask);
        mask = _mm_cmpgt_epi8(*(__m128i *)(HighbdEvenOddMaskx[base_shift] + 16),
                              _mm_set1_epi8(15));
        a1_x128 = _mm_blendv_epi8(atmp2, atmp3, mask);
        shift = _mm256_srli_epi32(
            _mm256_and_si256(
                _mm256_slli_epi32(
                    _mm256_setr_epi32(-y * dx, (1 << 6) - y * dx,
                                      (2 << 6) - y * dx, (3 << 6) - y * dx,
                                      (4 << 6) - y * dx, (5 << 6) - y * dx,
                                      (6 << 6) - y * dx, (7 << 6) - y * dx),
                    upsample_above),
                c3f),
            1);
      } else {
        a1_x128 = _mm_loadu_si128((__m128i *)(above + base_x + 1 + base_shift));
        a0_x128 =
            _mm_shuffle_epi8(a0_x128, *(__m128i *)HighbdLoadMaskx[base_shift]);
        a1_x128 =
            _mm_shuffle_epi8(a1_x128, *(__m128i *)HighbdLoadMaskx[base_shift]);

        shift = _mm256_srli_epi32(
            _mm256_and_si256(
                _mm256_setr_epi32(-y * dx, (1 << 6) - y * dx, (2 << 6) - y * dx,
                                  (3 << 6) - y * dx, (4 << 6) - y * dx,
                                  (5 << 6) - y * dx, (6 << 6) - y * dx,
                                  (7 << 6) - y * dx),
                c3f),
            1);
      }
      a0_x = _mm256_cvtepu16_epi32(a0_x128);
      a1_x = _mm256_cvtepu16_epi32(a1_x128);

      diff = _mm256_sub_epi32(a1_x, a0_x);  // a[x+1] - a[x]
      a32 = _mm256_slli_epi32(a0_x, 5);     // a[x] * 32
      a32 = _mm256_add_epi32(a32, a16);     // a[x] * 32 + 16

      b = _mm256_mullo_epi32(diff, shift);
      res = _mm256_add_epi32(a32, b);
      res = _mm256_srli_epi32(res, 5);

      resx = _mm256_castsi256_si128(_mm256_packus_epi32(
          res, _mm256_castsi128_si256(_mm256_extracti128_si256(res, 1))));
    }
    // y calc
    if (base_x < min_base_x) {
      DECLARE_ALIGNED(32, int, base_y_c[8]);
      __m256i r6, c256, dy256, y_c256, base_y_c256, mask256;
      r6 = _mm256_set1_epi32(r << 6);
      dy256 = _mm256_set1_epi32(dy);
      c256 = _mm256_setr_epi32(1, 2, 3, 4, 5, 6, 7, 8);
      y_c256 = _mm256_sub_epi32(r6, _mm256_mullo_epi32(c256, dy256));
      base_y_c256 = _mm256_srai_epi32(y_c256, frac_bits_y);
      mask256 = _mm256_cmpgt_epi32(min_base_y256, base_y_c256);
      base_y_c256 = _mm256_andnot_si256(mask256, base_y_c256);
      _mm256_store_si256((__m256i *)base_y_c, base_y_c256);

      a0_y = _mm256_cvtepu16_epi32(_mm_setr_epi16(
          left[base_y_c[0]], left[base_y_c[1]], left[base_y_c[2]],
          left[base_y_c[3]], left[base_y_c[4]], left[base_y_c[5]],
          left[base_y_c[6]], left[base_y_c[7]]));
      a1_y = _mm256_cvtepu16_epi32(_mm_setr_epi16(
          left[base_y_c[0] + 1], left[base_y_c[1] + 1], left[base_y_c[2] + 1],
          left[base_y_c[3] + 1], left[base_y_c[4] + 1], left[base_y_c[5] + 1],
          left[base_y_c[6] + 1], left[base_y_c[7] + 1]));

      if (upsample_left) {
        shift = _mm256_srli_epi32(
            _mm256_and_si256(_mm256_slli_epi32((y_c256), upsample_left), c3f),
            1);
      } else {
        shift = _mm256_srli_epi32(_mm256_and_si256(y_c256, c3f), 1);
      }
      diff = _mm256_sub_epi32(a1_y, a0_y);  // a[x+1] - a[x]
      a32 = _mm256_slli_epi32(a0_y, 5);     // a[x] * 32
      a32 = _mm256_add_epi32(a32, a16);     // a[x] * 32 + 16

      b = _mm256_mullo_epi32(diff, shift);
      res = _mm256_add_epi32(a32, b);
      res = _mm256_srli_epi32(res, 5);

      resy = _mm256_castsi256_si128(_mm256_packus_epi32(
          res, _mm256_castsi128_si256(_mm256_extracti128_si256(res, 1))));
    } else {
      resy = resx;
    }
    resxy =
        _mm_blendv_epi8(resx, resy, *(__m128i *)HighbdBaseMask[base_min_diff]);
    _mm_storeu_si128((__m128i *)(dst), resxy);
    dst += stride;
  }
}